

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_execSequenceEndSplitLitBuffer
                 (BYTE *op,BYTE *oend,BYTE *oend_w,seq_t sequence,BYTE **litPtr,BYTE *litLimit,
                 BYTE *prefixStart,BYTE *virtualStart,BYTE *dictEnd)

{
  BYTE *op_00;
  BYTE *op_01;
  BYTE *pBVar1;
  size_t __n;
  ulong *in_RCX;
  long in_RSI;
  BYTE *in_RDI;
  long in_R8;
  BYTE *in_R9;
  size_t length1;
  BYTE *match;
  BYTE *iLitEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  ptrdiff_t in_stack_ffffffffffffffa0;
  ZSTD_overlap_e ovtype;
  BYTE *local_8;
  
  op_00 = in_RDI + length1;
  local_8 = match + length1;
  op_01 = (BYTE *)(*in_RCX + length1);
  pBVar1 = op_00 + -(long)iLitEnd;
  if ((BYTE *)(in_RSI - (long)in_RDI) < local_8) {
    local_8 = (BYTE *)0xffffffffffffffba;
  }
  else if (in_R8 - *in_RCX < length1) {
    local_8 = (BYTE *)0xffffffffffffffec;
  }
  else {
    if (in_RDI + (long)local_8 <= in_RDI) {
      __assert_fail("op < op + sequenceLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa825,
                    "size_t ZSTD_execSequenceEndSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (local_8 + (long)in_RDI <= op_00) {
      __assert_fail("oLitEnd < op + sequenceLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa826,
                    "size_t ZSTD_execSequenceEndSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (((BYTE *)*in_RCX < in_RDI) && (in_RDI < (BYTE *)(*in_RCX + length1))) {
      local_8 = (BYTE *)0xffffffffffffffba;
    }
    else {
      ZSTD_safecopyDstBeforeSrc(op_01,pBVar1,in_stack_ffffffffffffffa0);
      ovtype = (ZSTD_overlap_e)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      *in_RCX = (ulong)op_01;
      if (op_00 + -(long)in_R9 < iLitEnd) {
        if (op_00 + -sequenceLength < iLitEnd) {
          return 0xffffffffffffffec;
        }
        pBVar1 = oLitEnd + -((long)in_R9 - (long)pBVar1);
        if (pBVar1 + (long)match <= oLitEnd) {
          memmove(op_00,pBVar1,(size_t)match);
          return (size_t)local_8;
        }
        __n = (long)oLitEnd - (long)pBVar1;
        memmove(op_00,pBVar1,__n);
        ovtype = (ZSTD_overlap_e)(__n >> 0x20);
        pBVar1 = in_R9;
      }
      ZSTD_safecopy(op_00,local_8,op_01,(ptrdiff_t)pBVar1,ovtype);
    }
  }
  return (size_t)local_8;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceEndSplitLitBuffer(BYTE* op,
    BYTE* const oend, const BYTE* const oend_w, seq_t sequence,
    const BYTE** litPtr, const BYTE* const litLimit,
    const BYTE* const prefixStart, const BYTE* const virtualStart, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;


    /* bounds checks : careful of address space overflow in 32-bit mode */
    RETURN_ERROR_IF(sequenceLength > (size_t)(oend - op), dstSize_tooSmall, "last match must fit within dstBuffer");
    RETURN_ERROR_IF(sequence.litLength > (size_t)(litLimit - *litPtr), corruption_detected, "try to read beyond literal buffer");
    assert(op < op + sequenceLength);
    assert(oLitEnd < op + sequenceLength);

    /* copy literals */
    RETURN_ERROR_IF(op > *litPtr && op < *litPtr + sequence.litLength, dstSize_tooSmall, "output should not catch up to and overwrite literal buffer");
    ZSTD_safecopyDstBeforeSrc(op, *litPtr, sequence.litLength);
    op = oLitEnd;
    *litPtr = iLitEnd;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - prefixStart)) {
        /* offset beyond prefix */
        RETURN_ERROR_IF(sequence.offset > (size_t)(oLitEnd - virtualStart), corruption_detected, "");
        match = dictEnd - (prefixStart - match);
        if (match + sequence.matchLength <= dictEnd) {
            ZSTD_memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
        ZSTD_memmove(oLitEnd, match, length1);
        op = oLitEnd + length1;
        sequence.matchLength -= length1;
        match = prefixStart;
        }
    }
    ZSTD_safecopy(op, oend_w, match, sequence.matchLength, ZSTD_overlap_src_before_dst);
    return sequenceLength;
}